

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcIShapeProfileDef::~IfcIShapeProfileDef(IfcIShapeProfileDef *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcParameterizedProfileDef.field_0x70 = 0x8811f8;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0x881220
  ;
  puVar1 = (undefined1 *)this[-1].FilletRadius.ptr;
  if (puVar1 != &this[-1].field_0xb0) {
    operator_delete(puVar1,*(long *)&this[-1].field_0xb0 + 1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.field_0x80;
  if ((Out *)puVar1 != &this[-1].WebThickness) {
    operator_delete(puVar1,(long)this[-1].WebThickness + 1);
  }
  operator_delete(&this[-1].super_IfcParameterizedProfileDef.field_0x70,200);
  return;
}

Assistant:

IfcIShapeProfileDef() : Object("IfcIShapeProfileDef") {}